

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharClass.hpp
# Opt level: O1

IndexVector * __thiscall
Centaurus::CharClass<wchar_t>::collect_borders
          (IndexVector *__return_storage_ptr__,CharClass<wchar_t> *this)

{
  wchar_t wVar1;
  pointer pRVar2;
  iterator iVar3;
  undefined8 in_RAX;
  Range<wchar_t> *r;
  pointer pRVar4;
  undefined8 local_38;
  
  local_38 = in_RAX;
  IndexVector::IndexVector
            (__return_storage_ptr__,
             (long)(this->m_ranges).
                   super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->m_ranges).
                   super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3,true);
  pRVar4 = (this->m_ranges).
           super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pRVar2 = (this->m_ranges).
           super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pRVar4 != pRVar2) {
    do {
      wVar1 = pRVar4->m_start;
      iVar3._M_current =
           (__return_storage_ptr__->super_vector<int,_std::allocator<int>_>).
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish;
      local_38._4_4_ = wVar1;
      if (iVar3._M_current ==
          (__return_storage_ptr__->super_vector<int,_std::allocator<int>_>).
          super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (&__return_storage_ptr__->super_vector<int,_std::allocator<int>_>,iVar3,
                   (int *)((long)&local_38 + 4));
      }
      else {
        *iVar3._M_current = wVar1;
        (__return_storage_ptr__->super_vector<int,_std::allocator<int>_>).
        super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
             iVar3._M_current + 1;
      }
      local_38 = CONCAT44(local_38._4_4_,pRVar4->m_end);
      iVar3._M_current =
           (__return_storage_ptr__->super_vector<int,_std::allocator<int>_>).
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          (__return_storage_ptr__->super_vector<int,_std::allocator<int>_>).
          super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (&__return_storage_ptr__->super_vector<int,_std::allocator<int>_>,iVar3,
                   (int *)&local_38);
      }
      else {
        *iVar3._M_current = pRVar4->m_end;
        (__return_storage_ptr__->super_vector<int,_std::allocator<int>_>).
        super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
             iVar3._M_current + 1;
      }
      pRVar4 = pRVar4 + 1;
    } while (pRVar4 != pRVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

IndexVector collect_borders() const
    {
        IndexVector ret(2 * m_ranges.size(), true);

        for (const auto& r : m_ranges)
        {
            ret.push_back(r.start());
            ret.push_back(r.end());
        }

        return ret;
    }